

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::connection::on_some_content_read
          (connection *this,error_code *e,size_t n,context *context,ehandler *h)

{
  bool bVar1;
  error_code *in_RSI;
  callback<void_(cppcms::http::context::completion_type)> *in_RDI;
  connection *in_R8;
  pair<char_*,_unsigned_long> buffer;
  int status;
  ehandler *in_stack_00000198;
  context *in_stack_000001a0;
  int in_stack_000001ac;
  connection *in_stack_000001b0;
  connection *c;
  string *in_stack_ffffffffffffff40;
  callback<void_(const_std::error_code_&,_unsigned_long)> *this_00;
  ehandler *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff58;
  anon_enum_32 args;
  size_t in_stack_ffffffffffffff68;
  context *in_stack_ffffffffffffff70;
  shared_ptr<cppcms::impl::cgi::connection> *in_stack_ffffffffffffff78;
  offset_in_connection_to_subr in_stack_ffffffffffffff80;
  undefined1 local_70 [8];
  pair<char_*,_unsigned_long> local_68;
  int local_58;
  request *in_stack_ffffffffffffffb0;
  error_code local_48 [2];
  connection *local_28;
  
  args = (anon_enum_32)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_28 = in_R8;
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    std::error_code::message_abi_cxx11_(local_48);
    set_error(local_28,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    local_58 = cppcms::http::context::on_content_progress
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (local_58 == 0) {
      cppcms::http::context::request((context *)0x37db8e);
      local_68 = cppcms::http::request::get_buffer(in_stack_ffffffffffffffb0);
      if ((callback<void_(const_std::error_code_&,_unsigned_long)> *)local_68.second ==
          (callback<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
        (*(code *)(in_RDI->call_ptr).p_[9].super_refcounted._vptr_refcounted)();
        booster::callback<void_(cppcms::http::context::completion_type)>::operator()(in_RDI,args);
      }
      else {
        c = (connection *)local_68.first;
        this_00 = (callback<void_(const_std::error_code_&,_unsigned_long)> *)local_68.second;
        self((connection *)local_68.first);
        mfunc_to_io_handler<cppcms::impl::cgi::connection,std::shared_ptr<cppcms::impl::cgi::connection>,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>const&,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(context **)0x0,
                   (callback<void_(cppcms::http::context::completion_type)> *)on_some_content_read);
        booster::callback<void(std::error_code_const&,unsigned_long)>::
        callback<booster::callable<void(std::error_code_const&,unsigned_long)>>
                  (this_00,(intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                            *)c);
        (**(code **)&(in_RDI->call_ptr).p_[8].super_refcounted.refs_)(in_RDI,c,this_00,local_70);
        booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
                  ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x37dc6d);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
        ~intrusive_ptr(&this_00->call_ptr);
        std::shared_ptr<cppcms::impl::cgi::connection>::~shared_ptr
                  ((shared_ptr<cppcms::impl::cgi::connection> *)0x37dc81);
      }
    }
    else {
      handle_http_error(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198);
    }
  }
  return;
}

Assistant:

void connection::on_some_content_read(booster::system::error_code const &e,size_t n,http::context *context,ehandler const &h)
{
	if(e) { set_error(h,e.message()); return; }


	int status = context->on_content_progress(n);
	if(status !=0) {
		 handle_http_error(status,context,h);
		 return;
	}

	std::pair<char *,size_t> buffer = context->request().get_buffer();

	if(buffer.second==0) {
		on_async_read_complete();
		h(http::context::operation_completed);
		return;
	}
	else {
		async_read_some(buffer.first,buffer.second,
			mfunc_to_io_handler(&connection::on_some_content_read,
				self(),
				context,
				h));
	}
}